

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall TCV::visit(TCV *this,Call *node)

{
  bool bVar1;
  string *psVar2;
  Variable *variable_00;
  int *piVar3;
  Error *error;
  Variable *variable;
  undefined1 local_40 [8];
  string nodeName;
  ASTNode *_node;
  Call *node_local;
  TCV *this_local;
  
  nodeName.field_2._8_8_ = AST::ASTNode::getChild(&node->super_ASTNode,0);
  psVar2 = AST::ASTNode::getName_abi_cxx11_((ASTNode *)nodeName.field_2._8_8_);
  std::__cxx11::string::string((string *)local_40,(string *)psVar2);
  bVar1 = isFuncCall(&node->super_ASTNode);
  if (bVar1) {
    handleChainCalls(this,(string *)local_40,&node->super_ASTNode);
  }
  else {
    bVar1 = isCalledOnObject(&node->super_ASTNode);
    if (!bVar1) {
      bVar1 = isCalledOnFunction(&node->super_ASTNode);
      if (!bVar1) {
        variable_00 = getAvailableVar(this,(string *)local_40);
        bVar1 = isCalledWithDimension(&node->super_ASTNode);
        if (bVar1) {
          checkIfArrayCalledWithRightDimensions
                    (this,variable_00,(string *)local_40,&node->super_ASTNode);
        }
        else {
          psVar2 = Variable::getType_abi_cxx11_(variable_00);
          std::__cxx11::string::operator=((string *)&this->returnType,(string *)psVar2);
          piVar3 = AST::ASTNode::getLineNumber((ASTNode *)nodeName.field_2._8_8_);
          this->position = *piVar3;
        }
        goto LAB_00166554;
      }
    }
    checkIfClassVariableCalledWithRightAccess(this,(string *)local_40,&node->super_ASTNode);
  }
LAB_00166554:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void TCV::visit(Call *node) {
    auto _node = node->getChild(0);
    auto nodeName = _node->getName();

    try {
        if (isFuncCall(node)) {

            handleChainCalls(nodeName, node);
            return;
        } else {
            if (isCalledOnObject(node) || isCalledOnFunction(node)) {
                checkIfClassVariableCalledWithRightAccess(nodeName, node);
                return;
            }
        }

        const Variable *variable = getAvailableVar(nodeName);
        if (isCalledWithDimension(node)) {
            checkIfArrayCalledWithRightDimensions(variable, nodeName, node);
            return;
        }

        returnType = variable->getType();
        position = _node->getLineNumber();
    } catch (Semantic::Error &error) {
        detector->addError(error.what());
        return;
    }
}